

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<unsigned_long,char[3],char[5]>
          (Capturer *this,size_t index,unsigned_long *value,char (*values) [3],char (*values_1) [5])

{
  string sStack_48;
  
  Detail::stringify<unsigned_long>(&sStack_48,value);
  captureValue(this,index,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  captureValues<char[3],char[5]>(this,index + 1,values,values_1);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }